

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyBalance.c
# Opt level: O3

int Ivy_NodeCompareLevelsDecrease(Ivy_Obj_t **pp1,Ivy_Obj_t **pp2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = (uint)((int *)((ulong)*pp1 & 0xfffffffffffffffe))[2] >> 0xb;
  uVar3 = (uint)((int *)((ulong)*pp2 & 0xfffffffffffffffe))[2] >> 0xb;
  if (uVar4 <= uVar3) {
    if ((int)(uVar4 - uVar3) < 0) {
      return 1;
    }
    iVar1 = *(int *)((ulong)*pp2 & 0xfffffffffffffffe);
    iVar2 = *(int *)((ulong)*pp1 & 0xfffffffffffffffe);
    if (iVar2 <= iVar1) {
      return (int)(iVar2 != iVar1);
    }
  }
  return -1;
}

Assistant:

int Ivy_NodeCompareLevelsDecrease( Ivy_Obj_t ** pp1, Ivy_Obj_t ** pp2 )
{
    int Diff = Ivy_Regular(*pp1)->Level - Ivy_Regular(*pp2)->Level;
    if ( Diff > 0 )
        return -1;
    if ( Diff < 0 ) 
        return 1;
    Diff = Ivy_Regular(*pp1)->Id - Ivy_Regular(*pp2)->Id;
    if ( Diff > 0 )
        return -1;
    if ( Diff < 0 ) 
        return 1;
    return 0; 
}